

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void set_advisor_read_lock(char *filename)

{
  int iVar1;
  FILE *__stream;
  uint *puVar2;
  char *pcVar3;
  uint __errnum;
  char *msg;
  
  do {
    __stream = fopen64(filename,"wb");
    if (__stream != (FILE *)0x0) goto LAB_00104c80;
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
  } while (__errnum == 4);
  pcVar3 = strerror(__errnum);
  msg = "Error creating lock file %s error: %d %s";
LAB_00104ca6:
  logmsg(msg,filename,(ulong)__errnum,pcVar3);
  return;
LAB_00104c80:
  do {
    iVar1 = fclose(__stream);
    if (iVar1 == 0) {
      return;
    }
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
  } while (__errnum == 4);
  pcVar3 = strerror(__errnum);
  msg = "Error closing lock file %s error: %d %s";
  goto LAB_00104ca6;
}

Assistant:

void set_advisor_read_lock(const char *filename)
{
  FILE *lockfile;
  int error = 0;
  int res;

  do {
    lockfile = fopen(filename, "wb");
  } while((lockfile == NULL) && ((error = errno) == EINTR));
  if(lockfile == NULL) {
    logmsg("Error creating lock file %s error: %d %s",
           filename, error, strerror(error));
    return;
  }

  do {
    res = fclose(lockfile);
  } while(res && ((error = errno) == EINTR));
  if(res)
    logmsg("Error closing lock file %s error: %d %s",
           filename, error, strerror(error));
}